

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::BatchNorm_x86_avx::forward_inplace(BatchNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  _func_int **pp_Var5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  uint uVar25;
  float *pfVar26;
  undefined1 (*pauVar27) [32];
  int iVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  float *pfVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  float *pfVar37;
  uint uVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [28];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar59 [16];
  undefined1 auVar63 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  
  auVar24 = _DAT_005570e0;
  auVar23 = _DAT_005570c0;
  auVar42 = in_ZMM3._0_16_;
  iVar1 = bottom_top_blob->elempack;
  iVar28 = bottom_top_blob->dims;
  iVar2 = bottom_top_blob->w;
  uVar25 = bottom_top_blob->h;
  iVar3 = bottom_top_blob->d;
  uVar4 = bottom_top_blob->c;
  if (iVar28 == 2) {
    if ((int)uVar25 < 1) {
      return 0;
    }
    uVar35 = iVar1 * iVar2;
    pp_Var5 = this->_vptr_BatchNorm_x86_avx;
    uVar34 = 0;
    auVar40._8_8_ = 0x8000000000000000;
    auVar40._0_8_ = 0x8000000000000000;
    auVar42 = vpcmpeqd_avx(auVar42,auVar42);
    do {
      lVar32 = *(long *)(&this->field_0x1f8 + (long)pp_Var5[-3]);
      lVar6 = *(long *)(&this->field_0x240 + (long)pp_Var5[-3]);
      uVar38 = *(uint *)(lVar32 + uVar34 * 4);
      uVar30 = *(uint *)(lVar6 + uVar34 * 4);
      auVar41 = ZEXT416(uVar38);
      if (iVar1 == 4) {
        auVar43 = *(undefined1 (*) [16])(lVar32 + uVar34 * 0x10);
        auVar45._16_16_ = auVar43;
        auVar45._0_16_ = auVar43;
        auVar44 = *(undefined1 (*) [16])(lVar6 + uVar34 * 0x10);
LAB_0019e554:
        auVar52._16_16_ = auVar44;
        auVar52._0_16_ = auVar44;
        auVar51 = auVar52._0_28_;
      }
      else {
        auVar43 = vshufps_avx(ZEXT416(uVar38),ZEXT416(uVar38),0);
        auVar44 = vshufps_avx(ZEXT416(uVar30),ZEXT416(uVar30),0);
        if (iVar1 != 8) {
          auVar7 = vshufps_avx(auVar41,auVar41,0);
          auVar45._16_16_ = auVar7;
          auVar45._0_16_ = auVar7;
          goto LAB_0019e554;
        }
        auVar45 = *(undefined1 (*) [32])(lVar32 + uVar34 * 0x20);
        auVar51 = SUB3228(*(undefined1 (*) [32])(lVar6 + uVar34 * 0x20),0);
      }
      pauVar27 = (undefined1 (*) [32])
                 ((long)bottom_top_blob->w * uVar34 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar38 = 0;
      if (7 < (int)uVar35) {
        iVar29 = 7;
        do {
          auVar60._0_4_ = auVar51._0_4_ * *(float *)*pauVar27 + auVar45._0_4_;
          auVar60._4_4_ = auVar51._4_4_ * *(float *)((long)*pauVar27 + 4) + auVar45._4_4_;
          auVar60._8_4_ = auVar51._8_4_ * *(float *)((long)*pauVar27 + 8) + auVar45._8_4_;
          auVar60._12_4_ = auVar51._12_4_ * *(float *)((long)*pauVar27 + 0xc) + auVar45._12_4_;
          auVar60._16_4_ = auVar51._16_4_ * *(float *)((long)*pauVar27 + 0x10) + auVar45._16_4_;
          auVar60._20_4_ = auVar51._20_4_ * *(float *)((long)*pauVar27 + 0x14) + auVar45._20_4_;
          auVar60._24_4_ = auVar51._24_4_ * *(float *)((long)*pauVar27 + 0x18) + auVar45._24_4_;
          auVar60._28_4_ = in_ZMM10._28_4_ + auVar45._28_4_;
          in_ZMM10 = ZEXT3264(auVar60);
          *pauVar27 = auVar60;
          pauVar27 = pauVar27 + 1;
          iVar29 = iVar29 + 8;
          uVar38 = uVar35 & 0xfffffff8;
        } while (iVar29 < (int)uVar35);
      }
      uVar36 = uVar38 | 3;
      while ((int)uVar36 < (int)uVar35) {
        fVar9 = *(float *)((long)*pauVar27 + 4);
        fVar10 = *(float *)((long)*pauVar27 + 8);
        fVar11 = *(float *)((long)*pauVar27 + 0xc);
        *(float *)*pauVar27 = auVar44._0_4_ * *(float *)*pauVar27 + auVar43._0_4_;
        *(float *)((long)*pauVar27 + 4) = auVar44._4_4_ * fVar9 + auVar43._4_4_;
        *(float *)((long)*pauVar27 + 8) = auVar44._8_4_ * fVar10 + auVar43._8_4_;
        *(float *)((long)*pauVar27 + 0xc) = auVar44._12_4_ * fVar11 + auVar43._12_4_;
        pauVar27 = (undefined1 (*) [32])((long)*pauVar27 + 0x10);
        uVar36 = uVar38 + 7;
        uVar38 = uVar38 + 4;
      }
      if ((int)uVar38 < (int)uVar35) {
        uVar31 = CONCAT44(0,~uVar38 + uVar35);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = uVar31;
        auVar44 = vpshufd_avx(auVar43,0x44);
        auVar7 = vshufps_avx(ZEXT416(uVar30),ZEXT416(uVar30),0);
        auVar8 = vshufps_avx(auVar41,auVar41,0);
        auVar41 = vorps_avx(auVar44,auVar40);
        auVar43 = vorps_avx(auVar44,auVar40);
        uVar39 = 0;
        do {
          auVar47._8_8_ = 0;
          auVar47._0_8_ = uVar39;
          auVar47 = vpshufd_avx(auVar47,0x44);
          auVar53._16_16_ = auVar47;
          auVar53._0_16_ = auVar47;
          auVar45 = vorps_avx(auVar53,auVar23);
          auVar52 = vorps_avx(auVar53,auVar24);
          auVar47 = vorps_avx(auVar44,auVar40);
          auVar64._0_8_ = auVar52._16_8_ ^ 0x8000000000000000;
          auVar64._8_4_ = auVar52._24_4_;
          auVar64._12_4_ = auVar52._28_4_ ^ 0x80000000;
          auVar64 = vpcmpgtq_avx(auVar64,auVar47);
          auVar48._0_8_ = auVar52._0_8_ ^ 0x8000000000000000;
          auVar48._8_4_ = auVar52._8_4_;
          auVar48._12_4_ = auVar52._12_4_ ^ 0x80000000;
          auVar48 = vpcmpgtq_avx(auVar48,auVar41);
          auVar64 = vpackssdw_avx(auVar48,auVar64);
          auVar65._0_8_ = auVar45._16_8_ ^ 0x8000000000000000;
          auVar65._8_4_ = auVar45._24_4_;
          auVar65._12_4_ = auVar45._28_4_ ^ 0x80000000;
          auVar47 = vpcmpgtq_avx(auVar65,auVar47);
          auVar58._0_8_ = auVar45._0_8_ ^ 0x8000000000000000;
          auVar58._8_4_ = auVar45._8_4_;
          auVar58._12_4_ = auVar45._12_4_ ^ 0x80000000;
          auVar48 = vpcmpgtq_avx(auVar58,auVar43);
          auVar47 = vpackssdw_avx(auVar48,auVar47);
          auVar47 = vpackssdw_avx(auVar47 ^ auVar42,auVar64 ^ auVar42);
          auVar64 = vpmovsxwd_avx(auVar47);
          auVar47 = vpunpckhwd_avx(auVar47,auVar47);
          auVar54._16_16_ = auVar47;
          auVar54._0_16_ = auVar64;
          auVar45 = vmaskmovps_avx(auVar54,*(undefined1 (*) [32])((long)*pauVar27 + uVar39 * 4));
          auVar61._0_4_ = auVar45._0_4_ * auVar7._0_4_ + auVar8._0_4_;
          auVar61._4_4_ = auVar45._4_4_ * auVar7._4_4_ + auVar8._4_4_;
          auVar61._8_4_ = auVar45._8_4_ * auVar7._8_4_ + auVar8._8_4_;
          auVar61._12_4_ = auVar45._12_4_ * auVar7._12_4_ + auVar8._12_4_;
          auVar61._16_4_ = auVar45._16_4_ * auVar7._0_4_ + auVar8._0_4_;
          auVar61._20_4_ = auVar45._20_4_ * auVar7._4_4_ + auVar8._4_4_;
          auVar61._24_4_ = auVar45._24_4_ * auVar7._8_4_ + auVar8._8_4_;
          auVar61._28_4_ = auVar45._28_4_ + auVar8._12_4_;
          in_ZMM10 = ZEXT3264(auVar61);
          auVar45 = vmaskmovps_avx(auVar54,auVar61);
          *(undefined1 (*) [32])((long)*pauVar27 + uVar39 * 4) = auVar45;
          uVar39 = uVar39 + 8;
        } while ((uVar31 + 8 & 0x1fffffff8) != uVar39);
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 != uVar25);
  }
  else if (iVar28 == 1) {
    pfVar33 = (float *)bottom_top_blob->data;
    pfVar26 = *(float **)(&this->field_0x1f8 + (long)this->_vptr_BatchNorm_x86_avx[-3]);
    pfVar37 = *(float **)(&this->field_0x240 + (long)this->_vptr_BatchNorm_x86_avx[-3]);
    uVar38 = iVar1 * iVar2;
    uVar35 = 0;
    if (7 < (int)uVar38) {
      uVar35 = uVar38 & 0x7ffffff8;
      iVar29 = 7;
      do {
        fVar9 = pfVar37[1];
        fVar10 = pfVar37[2];
        fVar11 = pfVar37[3];
        fVar12 = pfVar37[4];
        fVar13 = pfVar37[5];
        fVar14 = pfVar37[6];
        fVar15 = pfVar37[7];
        fVar16 = pfVar26[1];
        fVar17 = pfVar26[2];
        fVar18 = pfVar26[3];
        fVar19 = pfVar26[4];
        fVar20 = pfVar26[5];
        fVar21 = pfVar26[6];
        fVar22 = pfVar26[7];
        *pfVar33 = *pfVar37 * *pfVar33 + *pfVar26;
        pfVar33[1] = fVar9 * pfVar33[1] + fVar16;
        pfVar33[2] = fVar10 * pfVar33[2] + fVar17;
        pfVar33[3] = fVar11 * pfVar33[3] + fVar18;
        pfVar33[4] = fVar12 * pfVar33[4] + fVar19;
        pfVar33[5] = fVar13 * pfVar33[5] + fVar20;
        pfVar33[6] = fVar14 * pfVar33[6] + fVar21;
        pfVar33[7] = fVar15 + fVar22;
        pfVar33 = pfVar33 + 8;
        pfVar26 = pfVar26 + 8;
        pfVar37 = pfVar37 + 8;
        iVar29 = iVar29 + 8;
      } while (iVar29 < (int)uVar38);
    }
    uVar30 = uVar35 | 3;
    while ((int)uVar30 < (int)uVar38) {
      fVar9 = pfVar37[1];
      fVar10 = pfVar37[2];
      fVar11 = pfVar37[3];
      fVar12 = pfVar26[1];
      fVar13 = pfVar26[2];
      fVar14 = pfVar26[3];
      *pfVar33 = *pfVar37 * *pfVar33 + *pfVar26;
      pfVar33[1] = fVar9 * pfVar33[1] + fVar12;
      pfVar33[2] = fVar10 * pfVar33[2] + fVar13;
      pfVar33[3] = fVar11 * pfVar33[3] + fVar14;
      pfVar33 = pfVar33 + 4;
      pfVar26 = pfVar26 + 4;
      pfVar37 = pfVar37 + 4;
      uVar30 = uVar35 + 7;
      uVar35 = uVar35 + 4;
    }
    if (uVar38 - uVar35 != 0 && (int)uVar35 <= (int)uVar38) {
      lVar32 = 0;
      do {
        pfVar33[lVar32] = pfVar33[lVar32] * pfVar37[lVar32] + pfVar26[lVar32];
        lVar32 = lVar32 + 1;
      } while (uVar38 - uVar35 != (int)lVar32);
    }
  }
  auVar24 = _DAT_005570e0;
  auVar23 = _DAT_005570c0;
  if ((iVar28 - 3U < 2) && (0 < (int)uVar4)) {
    uVar25 = iVar2 * iVar1 * uVar25 * iVar3;
    pp_Var5 = this->_vptr_BatchNorm_x86_avx;
    uVar34 = 0;
    auVar41._8_8_ = 0x8000000000000000;
    auVar41._0_8_ = 0x8000000000000000;
    auVar42 = vpcmpeqd_avx(auVar42,auVar42);
    do {
      lVar32 = *(long *)(&this->field_0x1f8 + (long)pp_Var5[-3]);
      lVar6 = *(long *)(&this->field_0x240 + (long)pp_Var5[-3]);
      uVar35 = *(uint *)(lVar32 + uVar34 * 4);
      uVar38 = *(uint *)(lVar6 + uVar34 * 4);
      auVar40 = ZEXT416(uVar35);
      if (iVar1 == 4) {
        auVar43 = *(undefined1 (*) [16])(lVar32 + uVar34 * 0x10);
        auVar46._16_16_ = auVar43;
        auVar46._0_16_ = auVar43;
        auVar44 = *(undefined1 (*) [16])(lVar6 + uVar34 * 0x10);
LAB_0019e7a7:
        auVar55._16_16_ = auVar44;
        auVar55._0_16_ = auVar44;
        auVar51 = auVar55._0_28_;
      }
      else {
        auVar43 = vshufps_avx(ZEXT416(uVar35),ZEXT416(uVar35),0);
        auVar44 = vshufps_avx(ZEXT416(uVar38),ZEXT416(uVar38),0);
        if (iVar1 != 8) {
          auVar7 = vshufps_avx(auVar40,auVar40,0);
          auVar46._16_16_ = auVar7;
          auVar46._0_16_ = auVar7;
          goto LAB_0019e7a7;
        }
        auVar46 = *(undefined1 (*) [32])(lVar32 + uVar34 * 0x20);
        auVar51 = SUB3228(*(undefined1 (*) [32])(lVar6 + uVar34 * 0x20),0);
      }
      pauVar27 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar34 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar35 = 0;
      if (7 < (int)uVar25) {
        iVar28 = 7;
        do {
          auVar62._0_4_ = auVar51._0_4_ * *(float *)*pauVar27 + auVar46._0_4_;
          auVar62._4_4_ = auVar51._4_4_ * *(float *)((long)*pauVar27 + 4) + auVar46._4_4_;
          auVar62._8_4_ = auVar51._8_4_ * *(float *)((long)*pauVar27 + 8) + auVar46._8_4_;
          auVar62._12_4_ = auVar51._12_4_ * *(float *)((long)*pauVar27 + 0xc) + auVar46._12_4_;
          auVar62._16_4_ = auVar51._16_4_ * *(float *)((long)*pauVar27 + 0x10) + auVar46._16_4_;
          auVar62._20_4_ = auVar51._20_4_ * *(float *)((long)*pauVar27 + 0x14) + auVar46._20_4_;
          auVar62._24_4_ = auVar51._24_4_ * *(float *)((long)*pauVar27 + 0x18) + auVar46._24_4_;
          auVar62._28_4_ = in_ZMM10._28_4_ + auVar46._28_4_;
          in_ZMM10 = ZEXT3264(auVar62);
          *pauVar27 = auVar62;
          pauVar27 = pauVar27 + 1;
          iVar28 = iVar28 + 8;
          uVar35 = uVar25 & 0xfffffff8;
        } while (iVar28 < (int)uVar25);
      }
      uVar30 = uVar35 | 3;
      while ((int)uVar30 < (int)uVar25) {
        fVar9 = *(float *)((long)*pauVar27 + 4);
        fVar10 = *(float *)((long)*pauVar27 + 8);
        fVar11 = *(float *)((long)*pauVar27 + 0xc);
        *(float *)*pauVar27 = auVar44._0_4_ * *(float *)*pauVar27 + auVar43._0_4_;
        *(float *)((long)*pauVar27 + 4) = auVar44._4_4_ * fVar9 + auVar43._4_4_;
        *(float *)((long)*pauVar27 + 8) = auVar44._8_4_ * fVar10 + auVar43._8_4_;
        *(float *)((long)*pauVar27 + 0xc) = auVar44._12_4_ * fVar11 + auVar43._12_4_;
        pauVar27 = (undefined1 (*) [32])((long)*pauVar27 + 0x10);
        uVar30 = uVar35 + 7;
        uVar35 = uVar35 + 4;
      }
      if ((int)uVar35 < (int)uVar25) {
        uVar31 = CONCAT44(0,~uVar35 + uVar25);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = uVar31;
        auVar44 = vpshufd_avx(auVar44,0x44);
        auVar7 = vshufps_avx(ZEXT416(uVar38),ZEXT416(uVar38),0);
        auVar8 = vshufps_avx(auVar40,auVar40,0);
        auVar40 = vorps_avx(auVar44,auVar41);
        auVar43 = vorps_avx(auVar44,auVar41);
        uVar39 = 0;
        do {
          auVar49._8_8_ = 0;
          auVar49._0_8_ = uVar39;
          auVar47 = vpshufd_avx(auVar49,0x44);
          auVar56._16_16_ = auVar47;
          auVar56._0_16_ = auVar47;
          auVar45 = vorps_avx(auVar56,auVar23);
          auVar52 = vorps_avx(auVar56,auVar24);
          auVar47 = vorps_avx(auVar44,auVar41);
          auVar66._0_8_ = auVar52._16_8_ ^ 0x8000000000000000;
          auVar66._8_4_ = auVar52._24_4_;
          auVar66._12_4_ = auVar52._28_4_ ^ 0x80000000;
          auVar64 = vpcmpgtq_avx(auVar66,auVar47);
          auVar50._0_8_ = auVar52._0_8_ ^ 0x8000000000000000;
          auVar50._8_4_ = auVar52._8_4_;
          auVar50._12_4_ = auVar52._12_4_ ^ 0x80000000;
          auVar48 = vpcmpgtq_avx(auVar50,auVar40);
          auVar64 = vpackssdw_avx(auVar48,auVar64);
          auVar67._0_8_ = auVar45._16_8_ ^ 0x8000000000000000;
          auVar67._8_4_ = auVar45._24_4_;
          auVar67._12_4_ = auVar45._28_4_ ^ 0x80000000;
          auVar47 = vpcmpgtq_avx(auVar67,auVar47);
          auVar59._0_8_ = auVar45._0_8_ ^ 0x8000000000000000;
          auVar59._8_4_ = auVar45._8_4_;
          auVar59._12_4_ = auVar45._12_4_ ^ 0x80000000;
          auVar48 = vpcmpgtq_avx(auVar59,auVar43);
          auVar47 = vpackssdw_avx(auVar48,auVar47);
          auVar47 = vpackssdw_avx(auVar47 ^ auVar42,auVar64 ^ auVar42);
          auVar64 = vpmovsxwd_avx(auVar47);
          auVar47 = vpunpckhwd_avx(auVar47,auVar47);
          auVar57._16_16_ = auVar47;
          auVar57._0_16_ = auVar64;
          auVar45 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])((long)*pauVar27 + uVar39 * 4));
          auVar63._0_4_ = auVar45._0_4_ * auVar7._0_4_ + auVar8._0_4_;
          auVar63._4_4_ = auVar45._4_4_ * auVar7._4_4_ + auVar8._4_4_;
          auVar63._8_4_ = auVar45._8_4_ * auVar7._8_4_ + auVar8._8_4_;
          auVar63._12_4_ = auVar45._12_4_ * auVar7._12_4_ + auVar8._12_4_;
          auVar63._16_4_ = auVar45._16_4_ * auVar7._0_4_ + auVar8._0_4_;
          auVar63._20_4_ = auVar45._20_4_ * auVar7._4_4_ + auVar8._4_4_;
          auVar63._24_4_ = auVar45._24_4_ * auVar7._8_4_ + auVar8._8_4_;
          auVar63._28_4_ = auVar45._28_4_ + auVar8._12_4_;
          in_ZMM10 = ZEXT3264(auVar63);
          auVar45 = vmaskmovps_avx(auVar57,auVar63);
          *(undefined1 (*) [32])((long)*pauVar27 + uVar39 * 4) = auVar45;
          uVar39 = uVar39 + 8;
        } while ((uVar31 + 8 & 0x1fffffff8) != uVar39);
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 != uVar4);
  }
  return 0;
}

Assistant:

int BatchNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}